

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_chord_height(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_ADJ pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_DBL *pRVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  REF_INT cell;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  REF_DBL n1 [3];
  REF_DBL n0 [3];
  int iStack_ac;
  REF_INT nodes [27];
  
  pRVar2 = ref_grid->node;
  *allowed = 0;
  ref_cell = ref_grid->cell[0];
  uVar10 = 0xffffffff;
  cell = -1;
  if (-1 < node1) {
    pRVar3 = ref_cell->ref_adj;
    uVar10 = 0xffffffff;
    cell = -1;
    if (node1 < pRVar3->nnode) {
      uVar7 = pRVar3->first[(uint)node1];
      uVar10 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar7 != -1) {
        cell = pRVar3->item[(int)uVar7].ref;
        uVar10 = (ulong)uVar7;
      }
    }
  }
  do {
    if ((int)uVar10 == -1) {
      *allowed = 1;
      return 0;
    }
    uVar7 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x25a,"ref_collapse_edge_chord_height",(ulong)uVar7,"nodes");
      return uVar7;
    }
    uVar9 = 0;
    uVar8 = (ulong)(uint)ref_cell->node_per;
    if (ref_cell->node_per < 1) {
      uVar8 = uVar9;
    }
    bVar6 = false;
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      if (nodes[uVar9] == node0) {
        bVar6 = true;
      }
    }
    if (!bVar6) {
      for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
        if (nodes[uVar9] == node1) {
          pRVar5 = pRVar2->real;
          iVar1 = nodes[1 - uVar9];
          for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
            dVar12 = pRVar5[node0 * 0xf + lVar11];
            n0[lVar11] = pRVar5[node1 * 0xf + lVar11] - dVar12;
            n1[lVar11] = pRVar5[iVar1 * 0xf + lVar11] - dVar12;
          }
          dVar15 = SQRT(n1[2] * n1[2] + n1[0] * n1[0] + n1[1] * n1[1]);
          dVar17 = n0[1] * n1[2] - n1[1] * n0[2];
          dVar16 = n0[2] * n1[0] - n1[2] * n0[0];
          dVar12 = n0[0] * n1[1] - n1[0] * n0[1];
          dVar12 = SQRT(dVar12 * dVar12 + dVar17 * dVar17 + dVar16 * dVar16);
          auVar13._0_8_ = dVar15 * 1e+20;
          auVar13._8_8_ = dVar12;
          auVar14._8_8_ = -dVar12;
          auVar14._0_8_ = -auVar13._0_8_;
          auVar14 = maxpd(auVar13,auVar14);
          if (auVar14._0_8_ <= auVar14._8_8_) {
            return 0;
          }
          dVar12 = dVar12 / dVar15;
          if (0.1 < dVar12 / dVar15) {
            return 0;
          }
          if (dVar12 <= -dVar12) {
            dVar12 = -dVar12;
          }
          if (auVar14._0_8_ <= dVar12) {
            return 0;
          }
        }
      }
    }
    pRVar4 = ref_cell->ref_adj->item;
    uVar10 = (ulong)pRVar4[(int)uVar10].next;
    cell = -1;
    if (uVar10 != 0xffffffffffffffff) {
      cell = pRVar4[uVar10].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_chord_height(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;
  REF_INT i;
  REF_DBL n0[3], n1[3], cross_prod[3];
  REF_DBL new_length, cross_length, chord, chord_ratio;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) {
        /* triangle node0, node1, nodes[node] */
        /* nodes[node] = node0; */
        for (i = 0; i < 3; i++) {
          n0[i] = ref_node_xyz(ref_node, i, node1) -
                  ref_node_xyz(ref_node, i, node0);
          n1[i] = ref_node_xyz(ref_node, i, nodes[1 - node]) -
                  ref_node_xyz(ref_node, i, node0);
        }
        new_length = sqrt(ref_math_dot(n1, n1));
        ref_math_cross_product(n0, n1, cross_prod);
        cross_length = sqrt(ref_math_dot(cross_prod, cross_prod));
        /* |n0 x n1| = |n0||n1|sin(t) */
        if (ref_math_divisible(cross_length, new_length)) {
          chord = cross_length / new_length;
          if (ref_math_divisible(chord, new_length)) {
            chord_ratio = chord / new_length;
            if (chord_ratio > 0.1) return REF_SUCCESS;
          } else {
            return REF_SUCCESS;
          }
        } else {
          return REF_SUCCESS;
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}